

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O0

UnlocalizedNumberFormatter *
icu_63::number::impl::NumberPropertyMapper::create
          (UnlocalizedNumberFormatter *__return_storage_ptr__,DecimalFormatProperties *properties,
          DecimalFormatSymbols *symbols,DecimalFormatWarehouse *warehouse,
          DecimalFormatProperties *exportedProperties,UErrorCode *status)

{
  MacroProps local_3c0;
  UnlocalizedNumberFormatter local_200;
  UErrorCode *local_38;
  UErrorCode *status_local;
  DecimalFormatProperties *exportedProperties_local;
  DecimalFormatWarehouse *warehouse_local;
  DecimalFormatSymbols *symbols_local;
  DecimalFormatProperties *properties_local;
  
  local_38 = status;
  status_local = (UErrorCode *)exportedProperties;
  exportedProperties_local = (DecimalFormatProperties *)warehouse;
  warehouse_local = (DecimalFormatWarehouse *)symbols;
  symbols_local = (DecimalFormatSymbols *)properties;
  properties_local = (DecimalFormatProperties *)__return_storage_ptr__;
  NumberFormatter::with();
  oldToNew(&local_3c0,(DecimalFormatProperties *)symbols_local,
           (DecimalFormatSymbols *)warehouse_local,
           (DecimalFormatWarehouse *)exportedProperties_local,
           (DecimalFormatProperties *)status_local,local_38);
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
            (__return_storage_ptr__,
             &local_200.super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>,
             &local_3c0);
  MacroProps::~MacroProps(&local_3c0);
  UnlocalizedNumberFormatter::~UnlocalizedNumberFormatter(&local_200);
  return __return_storage_ptr__;
}

Assistant:

UnlocalizedNumberFormatter NumberPropertyMapper::create(const DecimalFormatProperties& properties,
                                                        const DecimalFormatSymbols& symbols,
                                                        DecimalFormatWarehouse& warehouse,
                                                        DecimalFormatProperties& exportedProperties,
                                                        UErrorCode& status) {
    return NumberFormatter::with().macros(
            oldToNew(
                    properties, symbols, warehouse, &exportedProperties, status));
}